

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O2

int mbedtls_cipher_cmac_update(mbedtls_cipher_context_t *ctx,uchar *input,size_t ilen)

{
  mbedtls_cmac_context_t *output;
  size_t sVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong block_size;
  size_t olen;
  
  iVar2 = -0x6100;
  if (((ctx != (mbedtls_cipher_context_t *)0x0) &&
      (input != (uchar *)0x0 && ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) &&
     (output = ctx->cmac_ctx, output != (mbedtls_cmac_context_t *)0x0)) {
    block_size = (ulong)ctx->cipher_info->block_size;
    sVar1 = output->unprocessed_len;
    if ((sVar1 != 0) && (block_size - sVar1 < ilen)) {
      memcpy(output->unprocessed_block + sVar1,input,block_size - sVar1);
      cmac_xor_block(output->state,output->unprocessed_block,output->state,block_size);
      iVar2 = mbedtls_cipher_update(ctx,output->state,block_size,output->state,&olen);
      if (iVar2 != 0) {
        return iVar2;
      }
      lVar3 = block_size - output->unprocessed_len;
      input = input + lVar3;
      ilen = ilen - lVar3;
      output->unprocessed_len = 0;
    }
    lVar3 = -ilen;
    for (uVar4 = 1; uVar4 < ((ilen + block_size) - 1) / block_size; uVar4 = uVar4 + 1) {
      cmac_xor_block(output->state,input,output->state,block_size);
      iVar2 = mbedtls_cipher_update(ctx,output->state,block_size,output->state,&olen);
      if (iVar2 != 0) {
        return iVar2;
      }
      input = input + block_size;
      lVar3 = lVar3 + block_size;
    }
    iVar2 = 0;
    if (lVar3 != 0) {
      memcpy(output->unprocessed_block + output->unprocessed_len,input,-lVar3);
      output->unprocessed_len = output->unprocessed_len - lVar3;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_cmac_update( mbedtls_cipher_context_t *ctx,
                                const unsigned char *input, size_t ilen )
{
    mbedtls_cmac_context_t* cmac_ctx;
    unsigned char *state;
    int ret = 0;
    size_t n, j, olen, block_size;

    if( ctx == NULL || ctx->cipher_info == NULL || input == NULL ||
        ctx->cmac_ctx == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    cmac_ctx = ctx->cmac_ctx;
    block_size = ctx->cipher_info->block_size;
    state = ctx->cmac_ctx->state;

    /* Is there data still to process from the last call, that's greater in
     * size than a block? */
    if( cmac_ctx->unprocessed_len > 0 &&
        ilen > block_size - cmac_ctx->unprocessed_len )
    {
        memcpy( &cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
                input,
                block_size - cmac_ctx->unprocessed_len );

        cmac_xor_block( state, cmac_ctx->unprocessed_block, state, block_size );

        if( ( ret = mbedtls_cipher_update( ctx, state, block_size, state,
                                           &olen ) ) != 0 )
        {
           goto exit;
        }

        input += block_size - cmac_ctx->unprocessed_len;
        ilen -= block_size - cmac_ctx->unprocessed_len;
        cmac_ctx->unprocessed_len = 0;
    }

    /* n is the number of blocks including any final partial block */
    n = ( ilen + block_size - 1 ) / block_size;

    /* Iterate across the input data in block sized chunks, excluding any
     * final partial or complete block */
    for( j = 1; j < n; j++ )
    {
        cmac_xor_block( state, input, state, block_size );

        if( ( ret = mbedtls_cipher_update( ctx, state, block_size, state,
                                           &olen ) ) != 0 )
           goto exit;

        ilen -= block_size;
        input += block_size;
    }

    /* If there is data left over that wasn't aligned to a block */
    if( ilen > 0 )
    {
        memcpy( &cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
                input,
                ilen );
        cmac_ctx->unprocessed_len += ilen;
    }

exit:
    return( ret );
}